

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O3

TestStatus *
vkt::synchronization::anon_unknown_0::singleSubmissionCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice *ppVVar1;
  long lVar2;
  long *plVar3;
  deUint32 queueFamilyIndex;
  VkResult result;
  int iVar4;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar5;
  long lVar6;
  Move<vk::Handle<(vk::HandleType)10>_> local_158;
  VkCommandBuffer cmdBuffers [2];
  VkEvent local_128;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_120;
  VkCommandPool local_108;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_100;
  VkFence local_e8;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_e0;
  VkSubmitInfo submitInfo;
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pVVar5 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_e0.m_device = (VkDevice)submitInfo._16_8_;
  DStack_e0.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_e8.m_internal = submitInfo._0_8_;
  DStack_e0.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  DStack_100.m_device = (VkDevice)submitInfo._16_8_;
  DStack_100.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_108.m_internal = submitInfo._0_8_;
  DStack_100.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  makeCommandBuffer(ptrCmdBuffer,vk,device,(VkCommandPool)submitInfo._0_8_);
  makeCommandBuffer(ptrCmdBuffer + 1,vk,device,local_108);
  submitInfo.pCommandBuffers = cmdBuffers;
  cmdBuffers[0] = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  cmdBuffers[1] = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 2;
  submitInfo._44_4_ = 0;
  ::vk::createEvent(&local_158,vk,device,0,(VkAllocationCallbacks *)0x0);
  DStack_120.m_device =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  DStack_120.m_allocator =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
  local_128.m_internal =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_120.m_deviceIface =
       local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
  beginCommandBuffer(vk,cmdBuffers[0]);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,cmdBuffers[0],local_128.m_internal,1);
  endCommandBuffer(vk,cmdBuffers[0]);
  beginCommandBuffer(vk,cmdBuffers[1]);
  (*vk->_vptr_DeviceInterface[0x6c])(vk,cmdBuffers[1],1,&local_128,1,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk,cmdBuffers[1]);
  result = (*vk->_vptr_DeviceInterface[2])(vk,pVVar5,1,&submitInfo,local_e8.m_internal);
  ::vk::checkResult(result,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0xcc);
  iVar4 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_e8,1,0xffffffffffffffff);
  ppVVar1 = &local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal =
       (deUint64)ppVVar1;
  if (iVar4 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Wait and set even on device single submission tests pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal,
               (undefined1 *)
               ((long)&(local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                       m_deviceIface)->_vptr_DeviceInterface +
               local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Queue should end execution","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal,
               (undefined1 *)
               ((long)&(local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                       m_deviceIface)->_vptr_DeviceInterface +
               local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal));
  }
  if ((VkDevice *)local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal
      != ppVVar1) {
    operator_delete((void *)local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.
                            m_internal,
                    (ulong)(local_158.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                            m_device + 1));
  }
  if (local_128.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_120,local_128);
  }
  lVar6 = 0x20;
  do {
    lVar2 = *(long *)((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object +
                     lVar6);
    if (lVar2 != 0) {
      plVar3 = *(long **)((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                 deleter.m_deviceIface + lVar6);
      submitInfo._0_8_ = lVar2;
      (**(code **)(*plVar3 + 0x240))
                (plVar3,*(undefined8 *)
                         ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                 deleter.m_device + lVar6),
                 *(undefined8 *)
                  ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                          m_pool.m_internal + lVar6),1,&submitInfo);
    }
    *(undefined8 *)
     ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device + lVar6)
         = 0;
    *(undefined8 *)
     ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal
     + lVar6) = 0;
    *(undefined8 *)
     ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + lVar6) = 0;
    *(undefined8 *)
     ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface +
     lVar6) = 0;
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  if (local_108.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_100,local_108);
  }
  if (local_e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_e0,local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus singleSubmissionCase (Context& context)
{
	enum {SET=0, WAIT, COUNT};
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Unique<VkFence>			fence				(createFence(vk, device));
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
	VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[SET], *ptrCmdBuffer[WAIT]};
	const VkSubmitInfo				submitInfo			=
														{
															VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
															DE_NULL,						// const void*					pNext;
															0u,								// deUint32						waitSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
															DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
															2u,								// deUint32						commandBufferCount;
															cmdBuffers,						// const VkCommandBuffer*		pCommandBuffers;
															0u,								// deUint32						signalSemaphoreCount;
															DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
														};
	const Unique<VkEvent>			event				(createEvent(vk, device));

	beginCommandBuffer(vk, cmdBuffers[SET]);
	vk.cmdSetEvent(cmdBuffers[SET], *event, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);
	endCommandBuffer(vk, cmdBuffers[SET]);

	beginCommandBuffer(vk, cmdBuffers[WAIT]);
	vk.cmdWaitEvents(cmdBuffers[WAIT], 1u, &event.get(),VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, cmdBuffers[WAIT]);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Wait and set even on device single submission tests pass");
}